

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O2

int strstart(char *str,char *val,char **ptr)

{
  while( true ) {
    if (*val == '\0') {
      if (ptr != (char **)0x0) {
        *ptr = str;
      }
      return 1;
    }
    if (*str != *val) break;
    str = str + 1;
    val = val + 1;
  }
  return 0;
}

Assistant:

int strstart(const char *str, const char *val, const char **ptr)
{
    const char *p, *q;
    p = str;
    q = val;
    while (*q != '\0') {
        if (*p != *q)
            return 0;
        p++;
        q++;
    }
    if (ptr)
        *ptr = p;
    return 1;
}